

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

size_t __thiscall
booster::locale::impl_icu::number_format<wchar_t>::do_parse<double>
          (number_format<wchar_t> *this,string_type *str,double *v)

{
  int iVar1;
  size_t sVar2;
  UErrorCode err;
  ParsePosition pp;
  UnicodeString tmp;
  Formattable val;
  code *local_e0;
  undefined8 local_d8;
  double local_d0;
  icu_std_converter<wchar_t,_4> local_c8 [16];
  Formattable local_88 [112];
  
  icu_70::Formattable::Formattable(local_88);
  local_e0 = std::_Rb_tree_increment;
  local_d8 = 0xffffffff00000000;
  icu_std_converter<wchar_t,_4>::icu
            (local_c8,(char_type_conflict *)&this->cvt_,(str->_M_dataplus)._M_p);
  (**(code **)(*(long *)this->icu_fmt_ + 0xa0))(this->icu_fmt_,local_c8,local_88,&local_e0);
  if ((int)local_d8 != 0) {
    local_d0 = (double)icu_70::Formattable::getDouble((UErrorCode *)local_88);
    iVar1 = icu_70::UnicodeString::countChar32((int)local_c8,0);
    if (iVar1 != 0) {
      sVar2 = (size_t)iVar1;
      *v = local_d0;
      goto LAB_00185b95;
    }
  }
  sVar2 = 0;
LAB_00185b95:
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)local_c8);
  icu_70::ParsePosition::~ParsePosition((ParsePosition *)&local_e0);
  icu_70::Formattable::~Formattable(local_88);
  return sVar2;
}

Assistant:

size_t do_parse(string_type const &str,ValueType &v) const
            {
                icu::Formattable val;
                icu::ParsePosition pp;
                icu::UnicodeString tmp = cvt_.icu(str.data(),str.data()+str.size());

                icu_fmt_->parse(tmp,val,pp);

                ValueType tmp_v;

                if(pp.getIndex() == 0 || !get_value(tmp_v,val))
                    return 0;
                size_t cut = cvt_.cut(tmp,str.data(),str.data()+str.size(),pp.getIndex());
                if(cut==0)
                    return 0;
                v=tmp_v;
                return cut;
            }